

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_run.c
# Opt level: O0

void set_fork_info(TestResult *tr,int status,int signal_expected,char allowed_exit_value)

{
  char cVar1;
  uint signal;
  char *pcVar2;
  bool bVar3;
  int signal_received;
  char exit_status;
  int was_exit;
  int was_sig;
  char allowed_exit_value_local;
  int signal_expected_local;
  int status_local;
  TestResult *tr_local;
  
  bVar3 = (status & 0x7fU) == 0;
  cVar1 = (char)((uint)status >> 8);
  signal = status & 0x7f;
  if ((char)(((byte)status & 0x7f) + 1) >> 1 < '\x01') {
    if (signal_expected == 0) {
      if ((bVar3) && (cVar1 == allowed_exit_value)) {
        tr->rtype = CK_PASS;
        if (tr->msg != (char *)0x0) {
          free(tr->msg);
        }
        pcVar2 = pass_msg();
        tr->msg = pcVar2;
      }
      else if ((bVar3) && (cVar1 != allowed_exit_value)) {
        if (tr->msg == (char *)0x0) {
          tr->rtype = CK_ERROR;
          pcVar2 = exit_msg((int)cVar1);
          tr->msg = pcVar2;
        }
        else {
          tr->rtype = CK_FAILURE;
        }
      }
    }
    else if (bVar3) {
      if (tr->msg != (char *)0x0) {
        free(tr->msg);
      }
      pcVar2 = exit_msg((int)cVar1);
      tr->msg = pcVar2;
      if (cVar1 == allowed_exit_value) {
        tr->rtype = CK_FAILURE;
      }
      else {
        tr->rtype = CK_FAILURE;
      }
    }
  }
  else if (signal_expected == signal) {
    if (alarm_received == 0) {
      tr->rtype = CK_PASS;
      if (tr->msg != (char *)0x0) {
        free(tr->msg);
      }
      pcVar2 = pass_msg();
      tr->msg = pcVar2;
    }
    else {
      tr->rtype = CK_ERROR;
      if (tr->msg != (char *)0x0) {
        free(tr->msg);
      }
      pcVar2 = signal_error_msg(signal,signal_expected);
      tr->msg = pcVar2;
    }
  }
  else if (signal_expected == 0) {
    tr->rtype = CK_ERROR;
    if (tr->msg != (char *)0x0) {
      free(tr->msg);
    }
    pcVar2 = signal_msg(signal);
    tr->msg = pcVar2;
  }
  else {
    tr->rtype = CK_ERROR;
    if (tr->msg != (char *)0x0) {
      free(tr->msg);
    }
    pcVar2 = signal_error_msg(signal,signal_expected);
    tr->msg = pcVar2;
  }
  return;
}

Assistant:

static void set_fork_info(TestResult * tr, int status, int signal_expected,
                          signed char allowed_exit_value)
{
    int was_sig = WIFSIGNALED(status);
    int was_exit = WIFEXITED(status);
    signed char exit_status = WEXITSTATUS(status);
    int signal_received = WTERMSIG(status);

    if(was_sig)
    {
        if(signal_expected == signal_received)
        {
            if(alarm_received)
            {
                /* Got alarm instead of signal */
                tr->rtype = CK_ERROR;
                if(tr->msg != NULL)
                {
                    free(tr->msg);
                }
                tr->msg = signal_error_msg(signal_received, signal_expected);
            }
            else
            {
                tr->rtype = CK_PASS;
                if(tr->msg != NULL)
                {
                    free(tr->msg);
                }
                tr->msg = pass_msg();
            }
        }
        else if(signal_expected != 0)
        {
            /* signal received, but not the expected one */
            tr->rtype = CK_ERROR;
            if(tr->msg != NULL)
            {
                free(tr->msg);
            }
            tr->msg = signal_error_msg(signal_received, signal_expected);
        }
        else
        {
            /* signal received and none expected */
            tr->rtype = CK_ERROR;
            if(tr->msg != NULL)
            {
                free(tr->msg);
            }
            tr->msg = signal_msg(signal_received);
        }
    }
    else if(signal_expected == 0)
    {
        if(was_exit && exit_status == allowed_exit_value)
        {
            tr->rtype = CK_PASS;
            if(tr->msg != NULL)
            {
                free(tr->msg);
            }
            tr->msg = pass_msg();
        }
        else if(was_exit && exit_status != allowed_exit_value)
        {
            if(tr->msg == NULL)
            {                   /* early exit */
                tr->rtype = CK_ERROR;
                tr->msg = exit_msg(exit_status);
            }
            else
            {
                tr->rtype = CK_FAILURE;
            }
        }
    }
    else
    {                           /* a signal was expected and none raised */
        if(was_exit)
        {
            if(tr->msg != NULL)
            {
                free(tr->msg);
            }
            tr->msg = exit_msg(exit_status);
            if(exit_status == allowed_exit_value)
            {
                tr->rtype = CK_FAILURE; /* normal exit status */
            }
            else
            {
                tr->rtype = CK_FAILURE; /* early exit */
            }
        }
    }
}